

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_DecompressFastArgs_init
                 (HUF_DecompressFastArgs *args,void *dst,size_t dstSize,void *src,size_t srcSize,
                 HUF_DTable *DTable)

{
  U16 UVar1;
  DTableDesc DVar2;
  uint uVar3;
  ulong uVar4;
  BYTE *ip;
  ulong uVar5;
  size_t sVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong in_R8;
  HUF_DTable *in_R9;
  size_t length4;
  size_t length3;
  size_t length2;
  size_t length1;
  BYTE *istart;
  BYTE *oend;
  BYTE *ilimit;
  U32 dtLog;
  void *dt;
  void *in_stack_ffffffffffffff78;
  
  DVar2 = HUF_getDTableDesc(in_R9);
  uVar3 = MEM_isLittleEndian();
  if ((uVar3 == 0) || (uVar3 = MEM_32bits(), uVar3 != 0)) {
    return 0;
  }
  if (in_R8 < 10) {
    return 0xffffffffffffffec;
  }
  if (((uint)DVar2 >> 0x10 & 0xff) != 0xb) {
    return 0;
  }
  UVar1 = MEM_readLE16(in_stack_ffffffffffffff78);
  uVar4 = (ulong)UVar1;
  UVar1 = MEM_readLE16(in_stack_ffffffffffffff78);
  ip = (BYTE *)(ulong)UVar1;
  UVar1 = MEM_readLE16(in_stack_ffffffffffffff78);
  uVar5 = (ulong)UVar1;
  in_RDI[0xf] = in_RCX + 6;
  in_RDI[0x10] = in_RDI[0xf] + uVar4;
  in_RDI[0x11] = (long)(ip + in_RDI[0x10]);
  in_RDI[0x12] = in_RDI[0x11] + uVar5;
  if ((((uVar4 < 0x10) || (ip < (BYTE *)0x8)) || (uVar5 < 8)) ||
     (in_R8 - (long)(ip + uVar5 + uVar4 + 6) < 8)) {
    return 0;
  }
  if (in_R8 < in_R8 - (long)(ip + uVar5 + uVar4 + 6)) {
    return 0xffffffffffffffec;
  }
  *in_RDI = in_RDI[0x10] + -8;
  in_RDI[1] = in_RDI[0x11] + -8;
  in_RDI[2] = in_RDI[0x12] + -8;
  in_RDI[3] = in_RCX + in_R8 + -8;
  in_RDI[4] = in_RSI;
  in_RDI[5] = in_RDI[4] + (in_RDX + 3U >> 2);
  in_RDI[6] = in_RDI[5] + (in_RDX + 3U >> 2);
  in_RDI[7] = in_RDI[6] + (in_RDX + 3U >> 2);
  if ((ulong)(in_RSI + in_RDX) <= (ulong)in_RDI[7]) {
    return 0;
  }
  sVar6 = HUF_initFastDStream(ip);
  in_RDI[8] = sVar6;
  sVar6 = HUF_initFastDStream(ip);
  in_RDI[9] = sVar6;
  sVar6 = HUF_initFastDStream(ip);
  in_RDI[10] = sVar6;
  sVar6 = HUF_initFastDStream(ip);
  in_RDI[0xb] = sVar6;
  in_RDI[0xd] = in_RCX + 0xe;
  in_RDI[0xe] = in_RSI + in_RDX;
  in_RDI[0xc] = (long)(in_R9 + 1);
  return 1;
}

Assistant:

static size_t HUF_DecompressFastArgs_init(HUF_DecompressFastArgs* args, void* dst, size_t dstSize, void const* src, size_t srcSize, const HUF_DTable* DTable)
{
    void const* dt = DTable + 1;
    U32 const dtLog = HUF_getDTableDesc(DTable).tableLog;

    const BYTE* const ilimit = (const BYTE*)src + 6 + 8;

    BYTE* const oend = (BYTE*)dst + dstSize;

    /* The fast decoding loop assumes 64-bit little-endian.
     * This condition is false on x32.
     */
    if (!MEM_isLittleEndian() || MEM_32bits())
        return 0;

    /* strict minimum : jump table + 1 byte per stream */
    if (srcSize < 10)
        return ERROR(corruption_detected);

    /* Must have at least 8 bytes per stream because we don't handle initializing smaller bit containers.
     * If table log is not correct at this point, fallback to the old decoder.
     * On small inputs we don't have enough data to trigger the fast loop, so use the old decoder.
     */
    if (dtLog != HUF_DECODER_FAST_TABLELOG)
        return 0;

    /* Read the jump table. */
    {
        const BYTE* const istart = (const BYTE*)src;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = srcSize - (length1 + length2 + length3 + 6);
        args->iend[0] = istart + 6;  /* jumpTable */
        args->iend[1] = args->iend[0] + length1;
        args->iend[2] = args->iend[1] + length2;
        args->iend[3] = args->iend[2] + length3;

        /* HUF_initFastDStream() requires this, and this small of an input
         * won't benefit from the ASM loop anyways.
         * length1 must be >= 16 so that ip[0] >= ilimit before the loop
         * starts.
         */
        if (length1 < 16 || length2 < 8 || length3 < 8 || length4 < 8)
            return 0;
        if (length4 > srcSize) return ERROR(corruption_detected);   /* overflow */
    }
    /* ip[] contains the position that is currently loaded into bits[]. */
    args->ip[0] = args->iend[1] - sizeof(U64);
    args->ip[1] = args->iend[2] - sizeof(U64);
    args->ip[2] = args->iend[3] - sizeof(U64);
    args->ip[3] = (BYTE const*)src + srcSize - sizeof(U64);

    /* op[] contains the output pointers. */
    args->op[0] = (BYTE*)dst;
    args->op[1] = args->op[0] + (dstSize+3)/4;
    args->op[2] = args->op[1] + (dstSize+3)/4;
    args->op[3] = args->op[2] + (dstSize+3)/4;

    /* No point to call the ASM loop for tiny outputs. */
    if (args->op[3] >= oend)
        return 0;

    /* bits[] is the bit container.
        * It is read from the MSB down to the LSB.
        * It is shifted left as it is read, and zeros are
        * shifted in. After the lowest valid bit a 1 is
        * set, so that CountTrailingZeros(bits[]) can be used
        * to count how many bits we've consumed.
        */
    args->bits[0] = HUF_initFastDStream(args->ip[0]);
    args->bits[1] = HUF_initFastDStream(args->ip[1]);
    args->bits[2] = HUF_initFastDStream(args->ip[2]);
    args->bits[3] = HUF_initFastDStream(args->ip[3]);

    /* If ip[] >= ilimit, it is guaranteed to be safe to
        * reload bits[]. It may be beyond its section, but is
        * guaranteed to be valid (>= istart).
        */
    args->ilimit = ilimit;

    args->oend = oend;
    args->dt = dt;

    return 1;
}